

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::DefaultsTest::testProgramPipelineInfoLog
          (DefaultsTest *this,GLchar *expected_value)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  size_t sVar3;
  GLsizei log_size;
  GLchar log [4096];
  int local_11ac;
  undefined1 local_11a8 [120];
  ios_base local_1130 [264];
  char local_1028 [4104];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  memset(local_1028,0,0x1000);
  local_11ac = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x998))
            (this->m_program_pipeline_dsa,0x1000,&local_11ac,local_1028);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetProgramPipelineInfoLog have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                  ,0x157);
  if (expected_value == (GLchar *)0x0) {
    if (local_11ac == 0) {
      return true;
    }
    local_11a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_11a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetProgramPipelineInfoLog returned unexpectedly non-empty string: ",0x44);
    sVar3 = strlen(local_1028);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1028,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_11a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    iVar2 = strcmp(local_1028,expected_value);
    if (iVar2 == 0) {
      return true;
    }
    local_11a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_11a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"glGetProgramPipelineInfoLog returned string: ",0x2d);
    sVar3 = strlen(local_1028);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1028,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", but is not the same as expected: ",0x23);
    sVar3 = strlen(expected_value);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,expected_value,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_11a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_11a8 + 8));
  std::ios_base::~ios_base(local_1130);
  return false;
}

Assistant:

bool DefaultsTest::testProgramPipelineInfoLog(glw::GLchar* expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Comparison limit. */
	static const glw::GLsizei max_log_size = 4096;

	/* Storage for data. */
	glw::GLchar log[max_log_size] = { 0 };

	/* Storage fetched length. */
	glw::GLsizei log_size = 0;

	/* Fetch. */
	gl.getProgramPipelineInfoLog(m_program_pipeline_dsa, max_log_size, &log_size, log);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineInfoLog have failed");

	/* Comparison. */
	if (DE_NULL == expected_value)
	{
		if (0 != log_size)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetProgramPipelineInfoLog returned unexpectedly non-empty string: " << log << "."
				<< tcu::TestLog::EndMessage;

			return false;
		}

		return true;
	}

	if (0 != strcmp(log, expected_value))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetProgramPipelineInfoLog returned string: " << log
			<< ", but is not the same as expected: " << expected_value << "." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}